

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

void Abc_NtkDontCareTruthOne(Odc_Man_t *p,Odc_Lit_t Lit)

{
  Odc_Lit_t OVar1;
  int iVar2;
  int iVar3;
  Odc_Obj_t *pObj_00;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  int fComp2;
  int fComp1;
  int k;
  uint *pInfo2;
  uint *pInfo1;
  uint *pInfo;
  Odc_Obj_t *pObj;
  Odc_Lit_t Lit_local;
  Odc_Man_t *p_local;
  
  iVar2 = Odc_IsComplement(Lit);
  if (iVar2 != 0) {
    __assert_fail("!Odc_IsComplement( Lit )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x395,"void Abc_NtkDontCareTruthOne(Odc_Man_t *, Odc_Lit_t)");
  }
  iVar2 = Odc_IsTerm(p,Lit);
  if (iVar2 != 0) {
    __assert_fail("!Odc_IsTerm( p, Lit )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x396,"void Abc_NtkDontCareTruthOne(Odc_Man_t *, Odc_Lit_t)");
  }
  pObj_00 = Odc_Lit2Obj(p,Lit);
  puVar4 = Odc_ObjTruth(p,Lit);
  OVar1 = Odc_ObjFanin0(pObj_00);
  puVar5 = Odc_ObjTruth(p,OVar1);
  OVar1 = Odc_ObjFanin1(pObj_00);
  puVar6 = Odc_ObjTruth(p,OVar1);
  iVar2 = Odc_ObjFaninC0(pObj_00);
  iVar3 = Odc_ObjFaninC1(pObj_00);
  if ((iVar2 == 0) || (iVar3 == 0)) {
    if ((iVar2 == 0) || (iVar3 != 0)) {
      if ((iVar2 == 0) && (iVar3 != 0)) {
        for (fComp2 = 0; fComp2 < p->nWords; fComp2 = fComp2 + 1) {
          puVar4[fComp2] = puVar5[fComp2] & (puVar6[fComp2] ^ 0xffffffff);
        }
      }
      else {
        for (fComp2 = 0; fComp2 < p->nWords; fComp2 = fComp2 + 1) {
          puVar4[fComp2] = puVar5[fComp2] & puVar6[fComp2];
        }
      }
    }
    else {
      for (fComp2 = 0; fComp2 < p->nWords; fComp2 = fComp2 + 1) {
        puVar4[fComp2] = (puVar5[fComp2] ^ 0xffffffff) & puVar6[fComp2];
      }
    }
  }
  else {
    for (fComp2 = 0; fComp2 < p->nWords; fComp2 = fComp2 + 1) {
      puVar4[fComp2] = (puVar5[fComp2] ^ 0xffffffff) & (puVar6[fComp2] ^ 0xffffffff);
    }
  }
  return;
}

Assistant:

void Abc_NtkDontCareTruthOne( Odc_Man_t * p, Odc_Lit_t Lit )
{
    Odc_Obj_t * pObj;
    unsigned * pInfo, * pInfo1, * pInfo2;
    int k, fComp1, fComp2;
    assert( !Odc_IsComplement( Lit ) );
    assert( !Odc_IsTerm( p, Lit ) );
    // get the truth tables
    pObj   = Odc_Lit2Obj( p, Lit );
    pInfo  = Odc_ObjTruth( p, Lit );
    pInfo1 = Odc_ObjTruth( p, Odc_ObjFanin0(pObj) );
    pInfo2 = Odc_ObjTruth( p, Odc_ObjFanin1(pObj) );
    fComp1 = Odc_ObjFaninC0( pObj );
    fComp2 = Odc_ObjFaninC1( pObj );
    // simulate
    if ( fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] = ~pInfo1[k] & ~pInfo2[k];
    else if ( fComp1 && !fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] = ~pInfo1[k] &  pInfo2[k];
    else if ( !fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] =  pInfo1[k] & ~pInfo2[k];
    else // if ( fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] =  pInfo1[k] &  pInfo2[k];
}